

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

ll_node * cli_parse_args(int argc,char **argv,char *prefix)

{
  int iVar1;
  int iVar2;
  ll_node *plVar3;
  size_t sVar4;
  ll_node *plVar5;
  ll_node *plVar6;
  char *pcVar7;
  char **ppcVar8;
  uint uVar9;
  char *local_40;
  ll_node *local_38;
  ulong uVar10;
  
  if (argv == (char **)0x0 || argc < 1) {
    plVar6 = (ll_node *)0x0;
  }
  else {
    uVar10 = 1;
    plVar6 = (ll_node *)0x0;
    plVar5 = (ll_node *)0x0;
    while (((plVar3 = plVar5, iVar2 = (int)uVar10, iVar2 < argc && (prefix != (char *)0x0)) &&
           (-1 < iVar2))) {
      pcVar7 = argv[uVar10];
      iVar1 = starts_with(prefix,pcVar7);
      if (iVar1 == 0) {
        pcVar7 = (char *)0x0;
      }
      uVar9 = (iVar2 + 1) - (uint)(pcVar7 == (char *)0x0);
      uVar10 = (ulong)uVar9;
      if ((int)uVar9 < argc) {
        uVar9 = argc;
      }
      ppcVar8 = argv + uVar10;
      plVar5 = (ll_node *)0x0;
      local_40 = pcVar7;
      for (; (int)uVar10 < argc; uVar10 = (ulong)((int)uVar10 + 1)) {
        pcVar7 = *ppcVar8;
        iVar2 = starts_with(prefix,pcVar7);
        if (iVar2 != 0) goto LAB_001027fc;
        sVar4 = strlen(pcVar7);
        if (plVar5 == (ll_node *)0x0) {
          plVar5 = ll_create_node(pcVar7,sVar4 + 1);
        }
        else {
          ll_append(plVar5,pcVar7,sVar4 + 1);
        }
        ppcVar8 = ppcVar8 + 1;
      }
      uVar10 = (ulong)uVar9;
LAB_001027fc:
      local_38 = plVar5;
      plVar5 = ll_create_node(&local_40,0x10);
      if (plVar5 == (ll_node *)0x0) {
        return plVar6;
      }
      if (plVar6 == (ll_node *)0x0) {
        plVar6 = plVar5;
      }
      if (plVar3 != (ll_node *)0x0) {
        plVar3->next = plVar5;
      }
    }
  }
  return plVar6;
}

Assistant:

struct ll_node *cli_parse_args(int argc, const char *argv[], const char *prefix)
{
	int pos = 1;
	int end = pos;
	struct ll_node *root_node = NULL;
	struct ll_node *prev_node = NULL;
	struct ll_node *cur_node = NULL;

	if (argc <= 0 || argv == NULL) {
		return NULL;
	}
	while (pos < argc) {
		prev_node = cur_node;
		cur_node = parse_arg_range(pos, argc, &end, argv, prefix);
		if (cur_node == NULL) {
			break;
		}
		if (root_node == NULL) {
			root_node = cur_node;
		}
		if (prev_node != NULL) {
			prev_node->next = cur_node;
		}
		pos = end;
	}
	return root_node;
}